

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

double __thiscall soplex::SVectorBase<double>::minAbs(SVectorBase<double> *this)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  Nonzero<double> *pNVar4;
  double dVar5;
  
  pdVar2 = (double *)infinity();
  dVar5 = *pdVar2;
  uVar3 = (ulong)(uint)this->memused;
  pNVar4 = this->m_elem + uVar3;
  while( true ) {
    pNVar4 = pNVar4 + -1;
    if ((int)uVar3 < 1) break;
    dVar1 = ABS(pNVar4->val);
    if (dVar5 <= ABS(pNVar4->val)) {
      dVar1 = dVar5;
    }
    dVar5 = dVar1;
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  return dVar5;
}

Assistant:

R minAbs() const
   {
      R mini = R(infinity);

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) < mini)
            mini = spxAbs(m_elem[i].val);
      }

      assert(mini >= 0);

      return mini;
   }